

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InlinePass::CreateReturnVar
          (InlinePass *this,Function *calleeFn,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t uVar1;
  int iVar2;
  StorageClass SVar3;
  IRContext *pIVar4;
  TypeManager *this_00;
  Type *pTVar5;
  undefined4 extraout_var;
  Instruction *this_01;
  DecorationManager *pDVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Operand *local_100;
  Type *pointee_type;
  iterator local_d8;
  undefined8 local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Operand local_a0;
  iterator local_70;
  _func_int **local_68;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_60;
  value_type local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> var_inst;
  uint32_t returnVarTypeId;
  TypeManager *type_mgr;
  uint32_t calleeTypeId;
  uint32_t returnVarId;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *new_vars_local;
  Function *calleeFn_local;
  InlinePass *this_local;
  
  uVar1 = Function::type_id(calleeFn);
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar4);
  pTVar5 = analysis::TypeManager::GetType(this_00,uVar1);
  iVar2 = (*pTVar5->_vptr_Type[5])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    var_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         analysis::TypeManager::FindPointerToType(this_00,uVar1,Function);
    if ((var_inst._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0) &&
       (var_inst._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
             AddPointerToType(this,uVar1,Function),
       var_inst._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0)) {
      this_local._4_4_ = 0;
    }
    else {
      pIVar4 = Pass::context(&this->super_Pass);
      this_local._4_4_ = IRContext::TakeNextId(pIVar4);
      if (this_local._4_4_ == 0) {
        this_local._4_4_ = 0;
      }
      else {
        this_01 = (Instruction *)operator_new(0x70);
        pIVar4 = Pass::context(&this->super_Pass);
        uVar1 = var_inst._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
        pointee_type._4_4_ = 7;
        local_d8 = (iterator)((long)&pointee_type + 4);
        local_d0 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_d8;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list);
        Operand::Operand(&local_a0,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_c8);
        local_70 = &local_a0;
        local_68 = (_func_int **)0x1;
        std::allocator<spvtools::opt::Operand>::allocator
                  ((allocator<spvtools::opt::Operand> *)((long)&pointee_type + 3));
        __l._M_len = (size_type)local_68;
        __l._M_array = local_70;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  (&local_60,__l,(allocator_type *)((long)&pointee_type + 3));
        Instruction::Instruction(this_01,pIVar4,OpVariable,uVar1,this_local._4_4_,&local_60);
        std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
        ::unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                  ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                    *)&local_48,this_01);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_60);
        std::allocator<spvtools::opt::Operand>::~allocator
                  ((allocator<spvtools::opt::Operand> *)((long)&pointee_type + 3));
        local_100 = (Operand *)&local_70;
        do {
          local_100 = local_100 + -1;
          Operand::~Operand(local_100);
        } while (local_100 != &local_a0);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
        std::
        vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ::push_back(new_vars,&local_48);
        pDVar6 = Pass::get_decoration_mgr(&this->super_Pass);
        uVar1 = Function::result_id(calleeFn);
        analysis::DecorationManager::CloneDecorations(pDVar6,uVar1,this_local._4_4_);
        pTVar5 = analysis::TypeManager::GetType
                           (this_00,var_inst._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                    _M_head_impl._4_4_);
        iVar2 = (*pTVar5->_vptr_Type[0x1f])();
        pTVar5 = analysis::Pointer::pointee_type((Pointer *)CONCAT44(extraout_var_00,iVar2));
        iVar2 = (*pTVar5->_vptr_Type[0x20])();
        if (CONCAT44(extraout_var_01,iVar2) != 0) {
          iVar2 = (*pTVar5->_vptr_Type[0x20])();
          SVar3 = analysis::Pointer::storage_class((Pointer *)CONCAT44(extraout_var_02,iVar2));
          if (SVar3 == PhysicalStorageBuffer) {
            pDVar6 = Pass::get_decoration_mgr(&this->super_Pass);
            analysis::DecorationManager::AddDecoration(pDVar6,this_local._4_4_,0x14ec);
          }
        }
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr(&local_48);
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("type_mgr->GetType(calleeTypeId)->AsVoid() == nullptr && \"Cannot create a return variable of type void.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                ,0xbf,
                "uint32_t spvtools::opt::InlinePass::CreateReturnVar(Function *, std::vector<std::unique_ptr<Instruction>> *)"
               );
}

Assistant:

uint32_t InlinePass::CreateReturnVar(
    Function* calleeFn, std::vector<std::unique_ptr<Instruction>>* new_vars) {
  uint32_t returnVarId = 0;
  const uint32_t calleeTypeId = calleeFn->type_id();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  assert(type_mgr->GetType(calleeTypeId)->AsVoid() == nullptr &&
         "Cannot create a return variable of type void.");
  // Find or create ptr to callee return type.
  uint32_t returnVarTypeId =
      type_mgr->FindPointerToType(calleeTypeId, spv::StorageClass::Function);

  if (returnVarTypeId == 0) {
    returnVarTypeId =
        AddPointerToType(calleeTypeId, spv::StorageClass::Function);
    if (returnVarTypeId == 0) {
      return 0;
    }
  }

  // Add return var to new function scope variables.
  returnVarId = context()->TakeNextId();
  if (returnVarId == 0) {
    return 0;
  }

  std::unique_ptr<Instruction> var_inst(new Instruction(
      context(), spv::Op::OpVariable, returnVarTypeId, returnVarId,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
        {(uint32_t)spv::StorageClass::Function}}}));
  new_vars->push_back(std::move(var_inst));
  get_decoration_mgr()->CloneDecorations(calleeFn->result_id(), returnVarId);

  // Decorate the return var with AliasedPointer if the storage class of the
  // pointee type is PhysicalStorageBuffer.
  auto const pointee_type =
      type_mgr->GetType(returnVarTypeId)->AsPointer()->pointee_type();
  if (pointee_type->AsPointer() != nullptr) {
    if (pointee_type->AsPointer()->storage_class() ==
        spv::StorageClass::PhysicalStorageBuffer) {
      get_decoration_mgr()->AddDecoration(
          returnVarId, uint32_t(spv::Decoration::AliasedPointer));
    }
  }

  return returnVarId;
}